

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_compress_greedy
               (libdeflate_compressor *c,u8 *in,size_t in_nbytes,deflate_output_bitstream *os)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint *puVar11;
  short sVar12;
  u32 uVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  u8 *data;
  libdeflate_compressor *c_00;
  uint *puVar17;
  long in_RCX;
  long lVar18;
  long in_RDX;
  uint *in_RSI;
  long in_RDI;
  undefined1 (*pauVar19) [16];
  bool bVar20;
  undefined1 auVar21 [16];
  u32 offset;
  u32 length;
  u32 min_len;
  deflate_sequence *seq;
  u8 *in_max_block_end;
  u8 *in_block_begin;
  u32 next_hashes [2];
  u32 nice_len;
  u32 max_len;
  u8 *in_cur_base;
  u8 *in_end;
  u8 *in_next;
  uint offset_slot;
  uint length_slot;
  deflate_sequence *seq_1;
  uint n;
  __m128i v;
  __m128i *p;
  mf_pos_t cutoff;
  u8 *in_base;
  u32 cur_pos;
  u32 len;
  u8 *matchptr;
  u32 seq4;
  u32 next_hashseq;
  u32 hash4;
  u32 hash3;
  mf_pos_t cur_node4;
  mf_pos_t cur_node3;
  u8 *best_matchptr;
  u32 depth_remaining;
  u32 v_2;
  u32 v_19;
  u32 v_18;
  u32 v_17;
  u32 v_16;
  u32 v_5;
  u32 v_3;
  machine_word_t v_word_1;
  u32 len_2;
  machine_word_t v_word;
  u32 len_1;
  machine_word_t v_13;
  machine_word_t v_12;
  machine_word_t v_11;
  machine_word_t v_10;
  machine_word_t v_9;
  machine_word_t v_8;
  machine_word_t v_7;
  machine_word_t v_6;
  machine_word_t v_15;
  machine_word_t v_14;
  machine_word_t v_27;
  machine_word_t v_26;
  machine_word_t v_25;
  machine_word_t v_24;
  machine_word_t v_23;
  machine_word_t v_22;
  machine_word_t v_21;
  machine_word_t v_20;
  machine_word_t v_29;
  machine_word_t v_28;
  u32 remaining;
  u32 next_hashseq_1;
  u32 hash4_1;
  u32 hash3_1;
  u32 cur_pos_1;
  u32 v_31;
  __m128i v_30;
  __m128i *p_2;
  __m128i v_1;
  __m128i *p_1;
  u32 v_4;
  undefined5 in_stack_fffffffffffff918;
  byte in_stack_fffffffffffff91d;
  undefined1 in_stack_fffffffffffff91e;
  byte in_stack_fffffffffffff91f;
  undefined2 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff922;
  undefined1 in_stack_fffffffffffff923;
  undefined1 in_stack_fffffffffffff924;
  undefined1 in_stack_fffffffffffff925;
  undefined2 in_stack_fffffffffffff926;
  uint local_6d8;
  undefined2 in_stack_fffffffffffff92c;
  u32 block_length;
  uint uVar22;
  undefined8 local_6a8;
  uint local_6a0;
  uint local_69c;
  uint *local_698;
  uint *local_688;
  uint *local_648;
  undefined8 uVar23;
  size_t data_len;
  long local_5b0;
  uint local_550;
  short local_52c;
  uint *local_528;
  int local_51c;
  uint local_4fc;
  ulong local_458;
  uint local_44c;
  ulong local_428;
  uint local_41c;
  int local_294;
  uint local_28c;
  uint local_288;
  uint local_284;
  uint *local_268;
  _Bool local_201;
  undefined1 (*local_1e8) [16];
  long local_1e0;
  undefined1 (*local_108) [16];
  long local_100;
  
  puVar16 = (uint *)((long)in_RSI + in_RDX);
  local_69c = 0x102;
  if (*(uint *)(in_RDI + 0x24) < 0x103) {
    uVar22 = *(uint *)(in_RDI + 0x24);
  }
  else {
    uVar22 = 0x102;
  }
  local_6a8 = 0;
  data = (u8 *)(in_RDI + 0x17c0);
  local_5b0 = 0x30000;
  block_length = CONCAT22(0x8000,in_stack_fffffffffffff92c);
  uVar23 = 0x8000800080008000;
  data_len = 0x8000800080008000;
  do {
    data[0] = '\0';
    data[1] = 0x80;
    data[2] = '\0';
    data[3] = 0x80;
    data[4] = '\0';
    data[5] = 0x80;
    data[6] = '\0';
    data[7] = 0x80;
    data[8] = '\0';
    data[9] = 0x80;
    data[10] = '\0';
    data[0xb] = 0x80;
    data[0xc] = '\0';
    data[0xd] = 0x80;
    data[0xe] = '\0';
    data[0xf] = 0x80;
    data[0x10] = '\0';
    data[0x11] = 0x80;
    data[0x12] = '\0';
    data[0x13] = 0x80;
    data[0x14] = '\0';
    data[0x15] = 0x80;
    data[0x16] = '\0';
    data[0x17] = 0x80;
    data[0x18] = '\0';
    data[0x19] = 0x80;
    data[0x1a] = '\0';
    data[0x1b] = 0x80;
    data[0x1c] = '\0';
    data[0x1d] = 0x80;
    data[0x1e] = '\0';
    data[0x1f] = 0x80;
    data[0x20] = '\0';
    data[0x21] = 0x80;
    data[0x22] = '\0';
    data[0x23] = 0x80;
    data[0x24] = '\0';
    data[0x25] = 0x80;
    data[0x26] = '\0';
    data[0x27] = 0x80;
    data[0x28] = '\0';
    data[0x29] = 0x80;
    data[0x2a] = '\0';
    data[0x2b] = 0x80;
    data[0x2c] = '\0';
    data[0x2d] = 0x80;
    data[0x2e] = '\0';
    data[0x2f] = 0x80;
    data[0x30] = '\0';
    data[0x31] = 0x80;
    data[0x32] = '\0';
    data[0x33] = 0x80;
    data[0x34] = '\0';
    data[0x35] = 0x80;
    data[0x36] = '\0';
    data[0x37] = 0x80;
    data[0x38] = '\0';
    data[0x39] = 0x80;
    data[0x3a] = '\0';
    data[0x3b] = 0x80;
    data[0x3c] = '\0';
    data[0x3d] = 0x80;
    data[0x3e] = '\0';
    data[0x3f] = 0x80;
    data = data + 0x40;
    local_5b0 = local_5b0 + -0x40;
    local_6a0 = uVar22;
    local_698 = in_RSI;
    local_688 = in_RSI;
  } while (local_5b0 != 0);
LAB_00103e84:
  puVar11 = local_688;
  local_648 = puVar16;
  if (0x4a767 < (ulong)((long)puVar16 - (long)local_688)) {
    local_648 = local_688 + 75000;
  }
  c_00 = (libdeflate_compressor *)(in_RDI + 0x417c0);
  init_block_split_stats((block_split_stats *)(in_RDI + 0x528));
  deflate_begin_sequences
            ((libdeflate_compressor *)
             CONCAT26(in_stack_fffffffffffff926,
                      CONCAT15(in_stack_fffffffffffff925,
                               CONCAT14(in_stack_fffffffffffff924,
                                        CONCAT13(in_stack_fffffffffffff923,
                                                 CONCAT12(in_stack_fffffffffffff922,
                                                          in_stack_fffffffffffff920))))),
             (deflate_sequence *)
             CONCAT17(in_stack_fffffffffffff91f,
                      CONCAT16(in_stack_fffffffffffff91e,
                               CONCAT15(in_stack_fffffffffffff91d,in_stack_fffffffffffff918))));
  uVar13 = calculate_min_match_len(data,data_len,(u32)((ulong)uVar23 >> 0x20));
LAB_00103f77:
  if ((ulong)((long)puVar16 - (long)local_688) < 0x102) {
    local_69c = (uint)((long)puVar16 - (long)local_688);
    local_6d8 = local_69c;
    if (local_6a0 <= local_69c) {
      local_6d8 = local_6a0;
    }
    local_6a0 = local_6d8;
  }
  pauVar19 = (undefined1 (*) [16])(in_RDI + 0x17c0);
  local_4fc = uVar13 - 1;
  local_51c = *(int *)(in_RDI + 0x20);
  local_528 = local_688;
  local_550 = (int)local_688 - (int)local_698;
  if (local_550 == 0x8000) {
    local_100 = 0x40000;
    in_stack_fffffffffffff926 = 0x8000;
    local_108 = pauVar19;
    do {
      auVar10._8_8_ = 0x8000800080008000;
      auVar10._0_8_ = 0x8000800080008000;
      auVar21 = paddsw(*local_108,auVar10);
      *local_108 = auVar21;
      auVar9._8_8_ = 0x8000800080008000;
      auVar9._0_8_ = 0x8000800080008000;
      auVar21 = paddsw(local_108[1],auVar9);
      local_108[1] = auVar21;
      auVar8._8_8_ = 0x8000800080008000;
      auVar8._0_8_ = 0x8000800080008000;
      auVar21 = paddsw(local_108[2],auVar8);
      local_108[2] = auVar21;
      auVar21._8_8_ = 0x8000800080008000;
      auVar21._0_8_ = 0x8000800080008000;
      auVar21 = paddsw(local_108[3],auVar21);
      local_108[3] = auVar21;
      local_108 = local_108 + 4;
      local_100 = local_100 + -0x40;
    } while (local_100 != 0);
    local_698 = local_698 + 0x2000;
    local_550 = 0;
  }
  sVar3 = (short)local_550;
  sVar12 = sVar3 + -0x8000;
  if (4 < local_69c) {
    sVar2 = *(short *)(*pauVar19 + (local_6a8 & 0xffffffff) * 2);
    local_52c = *(short *)(in_RDI + 0x117c0 + (ulong)local_6a8._4_4_ * 2);
    *(short *)(*pauVar19 + (local_6a8 & 0xffffffff) * 2) = sVar3;
    *(short *)(in_RDI + 0x117c0 + (ulong)local_6a8._4_4_ * 2) = sVar3;
    *(short *)(in_RDI + 0x317c0 + (ulong)local_550 * 2) = local_52c;
    local_6a8._0_4_ = (*(uint *)((long)local_688 + 1) & 0xffffff) * 0x1e35a7bd >> 0x11;
    if (local_4fc < 4) {
      if (sVar12 < sVar2) {
        if ((local_4fc < 3) &&
           (puVar17 = (uint *)((long)local_698 + (long)sVar2),
           (*puVar17 & 0xffffff) == (*local_688 & 0xffffff))) {
          local_4fc = 3;
          local_528 = puVar17;
        }
        if (sVar12 < local_52c) {
          do {
            puVar17 = (uint *)((long)local_698 + (long)local_52c);
            if (*puVar17 == *local_688) {
              local_41c = 4;
              if (local_69c - 4 < 0x20) goto LAB_00104a12;
              local_428 = *(ulong *)(puVar17 + 1) ^ *(ulong *)(local_688 + 1);
              if (local_428 != 0) goto LAB_00104b35;
              local_41c = 0xc;
              local_428 = *(ulong *)(puVar17 + 3) ^ *(ulong *)(local_688 + 3);
              if (local_428 != 0) goto LAB_00104b35;
              local_41c = 0x14;
              local_428 = *(ulong *)(puVar17 + 5) ^ *(ulong *)(local_688 + 5);
              if (local_428 != 0) goto LAB_00104b35;
              local_41c = 0x1c;
              local_428 = *(ulong *)(puVar17 + 7) ^ *(ulong *)(local_688 + 7);
              if (local_428 != 0) goto LAB_00104b35;
              local_41c = 0x24;
              goto LAB_00104a12;
            }
            local_52c = *(short *)(in_RDI + 0x317c0 + ((long)local_52c & 0x7fffU) * 2);
          } while ((sVar12 < local_52c) && (local_51c = local_51c + -1, local_51c != 0));
        }
      }
    }
    else if ((sVar12 < local_52c) && (local_4fc < local_6a0)) {
      do {
        while ((puVar17 = (uint *)((long)local_698 + (long)local_52c),
               *(int *)((long)puVar17 + ((ulong)local_4fc - 3)) !=
               *(int *)((long)local_688 + ((ulong)local_4fc - 3)) || (*puVar17 != *local_688))) {
          local_52c = *(short *)(in_RDI + 0x317c0 + ((long)local_52c & 0x7fffU) * 2);
          if ((local_52c <= sVar12) || (local_51c = local_51c + -1, local_51c == 0))
          goto LAB_00105240;
        }
        local_44c = 4;
        if (local_69c - 4 < 0x20) {
LAB_00105028:
          for (; local_44c + 8 <= local_69c; local_44c = local_44c + 8) {
            local_458 = *(ulong *)((long)puVar17 + (ulong)local_44c) ^
                        *(ulong *)((long)local_688 + (ulong)local_44c);
            if (local_458 != 0) goto LAB_0010514b;
          }
          while( true ) {
            bVar20 = false;
            if (local_44c < local_69c) {
              bVar20 = *(byte *)((long)puVar17 + (ulong)local_44c) ==
                       *(byte *)((long)local_688 + (ulong)local_44c);
            }
            if (!bVar20) break;
            local_44c = local_44c + 1;
          }
          in_stack_fffffffffffff924 = 0;
        }
        else {
          local_458 = *(ulong *)(puVar17 + 1) ^ *(ulong *)(local_688 + 1);
          if (local_458 == 0) {
            local_44c = 0xc;
            local_458 = *(ulong *)(puVar17 + 3) ^ *(ulong *)(local_688 + 3);
            if (local_458 == 0) {
              local_44c = 0x14;
              local_458 = *(ulong *)(puVar17 + 5) ^ *(ulong *)(local_688 + 5);
              if (local_458 == 0) {
                local_44c = 0x1c;
                local_458 = *(ulong *)(puVar17 + 7) ^ *(ulong *)(local_688 + 7);
                if (local_458 == 0) {
                  local_44c = 0x24;
                  goto LAB_00105028;
                }
              }
            }
          }
LAB_0010514b:
          uVar14 = 0;
          for (; (local_458 & 1) == 0; local_458 = local_458 >> 1 | 0x8000000000000000) {
            uVar14 = uVar14 + 1;
          }
          local_44c = (uVar14 >> 3) + local_44c;
        }
        if (((local_4fc < local_44c) &&
            (local_4fc = local_44c, local_528 = puVar17, local_6a0 <= local_44c)) ||
           (local_52c = *(short *)(in_RDI + 0x317c0 + ((long)local_52c & 0x7fffU) * 2),
           local_52c <= sVar12)) break;
joined_r0x00104bf4:
        local_51c = local_51c + -1;
      } while (local_51c != 0);
    }
  }
  goto LAB_00105240;
LAB_00104a12:
  if (local_69c < local_41c + 8) goto LAB_00104ac3;
  local_428 = *(ulong *)((long)puVar17 + (ulong)local_41c) ^
              *(ulong *)((long)local_688 + (ulong)local_41c);
  if (local_428 != 0) goto LAB_00104b35;
  local_41c = local_41c + 8;
  goto LAB_00104a12;
LAB_00104ac3:
  while( true ) {
    bVar20 = false;
    if (local_41c < local_69c) {
      bVar20 = *(byte *)((long)puVar17 + (ulong)local_41c) ==
               *(byte *)((long)local_688 + (ulong)local_41c);
    }
    if (!bVar20) break;
    local_41c = local_41c + 1;
  }
  in_stack_fffffffffffff925 = 0;
LAB_00104b81:
  local_4fc = local_41c;
  local_528 = puVar17;
  if ((local_41c < local_6a0) &&
     (local_52c = *(short *)(in_RDI + 0x317c0 + ((long)local_52c & 0x7fffU) * 2), sVar12 < local_52c
     )) goto joined_r0x00104bf4;
LAB_00105240:
  uVar14 = (int)local_688 - (int)local_528;
  if ((local_4fc < uVar13) || ((local_4fc < 4 && (0x1000 < uVar14)))) {
    bVar1 = (byte)*local_688;
    *(int *)(in_RDI + 0x28 + (ulong)bVar1 * 4) = *(int *)(in_RDI + 0x28 + (ulong)bVar1 * 4) + 1;
    lVar18 = (long)(int)((int)(uint)bVar1 >> 5 & 6U | bVar1 & 1);
    *(int *)(in_RDI + 0x528 + lVar18 * 4) = *(int *)(in_RDI + 0x528 + lVar18 * 4) + 1;
    *(int *)(in_RDI + 0x578) = *(int *)(in_RDI + 0x578) + 1;
    *(int *)&c_00->impl = *(int *)&c_00->impl + 1;
    local_688 = (uint *)((long)local_688 + 1);
  }
  else {
    in_stack_fffffffffffff923 = uVar14 != 0 && uVar14 < 0x8001;
    uVar15 = (uint)""[uVar14 - 1 >> (byte)(0x100 - uVar14 >> 0x1d)] + (0x100 - uVar14 >> 0x1d) * 2;
    *(int *)(in_RDI + 0x28 + (ulong)(""[local_4fc] + 0x101) * 4) =
         *(int *)(in_RDI + 0x28 + (ulong)(""[local_4fc] + 0x101) * 4) + 1;
    *(int *)(in_RDI + 0x4a8 + (ulong)uVar15 * 4) = *(int *)(in_RDI + 0x4a8 + (ulong)uVar15 * 4) + 1;
    lVar18 = (long)(int)((8 < local_4fc) + 8);
    *(int *)(in_RDI + 0x528 + lVar18 * 4) = *(int *)(in_RDI + 0x528 + lVar18 * 4) + 1;
    *(int *)(in_RDI + 0x578) = *(int *)(in_RDI + 0x578) + 1;
    *(uint *)&c_00->impl = local_4fc << 0x17 | *(uint *)&c_00->impl;
    *(short *)((long)&c_00->impl + 4) = (short)uVar14;
    *(short *)((long)&c_00->impl + 6) = (short)uVar15;
    c_00 = (libdeflate_compressor *)&c_00->free_func;
    *(undefined4 *)c_00 = 0;
    local_268 = (uint *)((long)local_688 + 1);
    local_294 = local_4fc - 1;
    if ((long)(ulong)(local_4fc + 4) <= (long)puVar16 - (long)local_268) {
      local_284 = (int)local_268 - (int)local_698;
      local_288 = (uint)local_6a8;
      local_28c = local_6a8._4_4_;
      do {
        if (local_284 == 0x8000) {
          local_1e0 = 0x40000;
          in_stack_fffffffffffff920 = 0x8000;
          local_1e8 = (undefined1 (*) [16])(in_RDI + 0x17c0);
          do {
            auVar7._8_8_ = 0x8000800080008000;
            auVar7._0_8_ = 0x8000800080008000;
            auVar21 = paddsw(*local_1e8,auVar7);
            *local_1e8 = auVar21;
            auVar6._8_8_ = 0x8000800080008000;
            auVar6._0_8_ = 0x8000800080008000;
            auVar21 = paddsw(local_1e8[1],auVar6);
            local_1e8[1] = auVar21;
            auVar5._8_8_ = 0x8000800080008000;
            auVar5._0_8_ = 0x8000800080008000;
            auVar21 = paddsw(local_1e8[2],auVar5);
            local_1e8[2] = auVar21;
            auVar4._8_8_ = 0x8000800080008000;
            auVar4._0_8_ = 0x8000800080008000;
            auVar21 = paddsw(local_1e8[3],auVar4);
            local_1e8[3] = auVar21;
            local_1e8 = local_1e8 + 4;
            local_1e0 = local_1e0 + -0x40;
          } while (local_1e0 != 0);
          local_698 = local_698 + 0x2000;
          local_284 = 0;
        }
        *(short *)(*(undefined1 (*) [16])(in_RDI + 0x17c0) + (ulong)local_288 * 2) =
             (short)local_284;
        *(undefined2 *)(in_RDI + 0x317c0 + (ulong)local_284 * 2) =
             *(undefined2 *)(in_RDI + 0x117c0 + (ulong)local_28c * 2);
        *(short *)(in_RDI + 0x117c0 + (ulong)local_28c * 2) = (short)local_284;
        local_268 = (uint *)((long)local_268 + 1);
        local_288 = (*local_268 & 0xffffff) * 0x1e35a7bd >> 0x11;
        local_28c = *local_268 * 0x1e35a7bd >> 0x10;
        local_284 = local_284 + 1;
        local_294 = local_294 + -1;
      } while (local_294 != 0);
      local_6a8._0_4_ = local_288;
    }
    local_688 = (uint *)((long)local_688 + (ulong)local_4fc);
  }
  in_stack_fffffffffffff91f = false;
  if ((local_688 < local_648) &&
     (in_stack_fffffffffffff91f = false, c_00 < (libdeflate_compressor *)(in_RDI + 0xa3240U))) {
    in_stack_fffffffffffff91e = false;
    if ((0x1ff < *(uint *)(in_RDI + 0x578)) &&
       (in_stack_fffffffffffff91e = false, 4999 < (long)local_688 - (long)puVar11)) {
      in_stack_fffffffffffff91e = 4999 < (long)puVar16 - (long)local_688;
    }
    if ((bool)in_stack_fffffffffffff91e == false) {
      local_201 = false;
    }
    else {
      local_201 = do_end_block_check((block_split_stats *)CONCAT44(uVar13,local_4fc),uVar14);
    }
    in_stack_fffffffffffff91f = local_201 ^ 0xff;
  }
  if ((in_stack_fffffffffffff91f & 1) == 0) goto code_r0x00105c46;
  goto LAB_00103f77;
LAB_00104b35:
  uVar14 = 0;
  for (; (local_428 & 1) == 0; local_428 = local_428 >> 1 | 0x8000000000000000) {
    uVar14 = uVar14 + 1;
  }
  local_41c = (uVar14 >> 3) + local_41c;
  goto LAB_00104b81;
code_r0x00105c46:
  deflate_finish_block
            (c_00,(deflate_output_bitstream *)CONCAT44(uVar13,local_4fc),
             (u8 *)CONCAT44(uVar14,uVar22),block_length,
             (deflate_sequence *)
             CONCAT26(in_stack_fffffffffffff926,
                      CONCAT15(in_stack_fffffffffffff925,
                               CONCAT14(in_stack_fffffffffffff924,
                                        CONCAT13(in_stack_fffffffffffff923,
                                                 CONCAT12(in_stack_fffffffffffff922,
                                                          in_stack_fffffffffffff920))))),
             (_Bool)in_stack_fffffffffffff91f);
  in_stack_fffffffffffff91d = 0;
  if (local_688 != puVar16) {
    in_stack_fffffffffffff91d = *(byte *)(in_RCX + 0x20) ^ 0xff;
  }
  if ((in_stack_fffffffffffff91d & 1) == 0) {
    return;
  }
  goto LAB_00103e84;
}

Assistant:

static void
deflate_compress_greedy(struct libdeflate_compressor * restrict c,
			const u8 *in, size_t in_nbytes,
			struct deflate_output_bitstream *os)
{
	const u8 *in_next = in;
	const u8 *in_end = in_next + in_nbytes;
	const u8 *in_cur_base = in_next;
	u32 max_len = DEFLATE_MAX_MATCH_LEN;
	u32 nice_len = MIN(c->nice_match_length, max_len);
	u32 next_hashes[2] = {0, 0};

	hc_matchfinder_init(&c->p.g.hc_mf);

	do {
		/* Starting a new DEFLATE block */

		const u8 * const in_block_begin = in_next;
		const u8 * const in_max_block_end = choose_max_block_end(
				in_next, in_end, SOFT_MAX_BLOCK_LENGTH);
		struct deflate_sequence *seq = c->p.g.sequences;
		u32 min_len;

		init_block_split_stats(&c->split_stats);
		deflate_begin_sequences(c, seq);
		min_len = calculate_min_match_len(in_next,
						  in_max_block_end - in_next,
						  c->max_search_depth);
		do {
			u32 length;
			u32 offset;

			adjust_max_and_nice_len(&max_len, &nice_len,
						in_end - in_next);
			length = hc_matchfinder_longest_match(
						&c->p.g.hc_mf,
						&in_cur_base,
						in_next,
						min_len - 1,
						max_len,
						nice_len,
						c->max_search_depth,
						next_hashes,
						&offset);

			if (length >= min_len &&
			    (length > DEFLATE_MIN_MATCH_LEN ||
			     offset <= 4096)) {
				/* Match found */
				deflate_choose_match(c, length, offset, true,
						     &seq);
				hc_matchfinder_skip_bytes(&c->p.g.hc_mf,
							  &in_cur_base,
							  in_next + 1,
							  in_end,
							  length - 1,
							  next_hashes);
				in_next += length;
			} else {
				/* No match found */
				deflate_choose_literal(c, *in_next++, true,
						       seq);
			}

			/* Check if it's time to output another block. */
		} while (in_next < in_max_block_end &&
			 seq < &c->p.g.sequences[SEQ_STORE_LENGTH] &&
			 !should_end_block(&c->split_stats,
					   in_block_begin, in_next, in_end));

		deflate_finish_block(c, os, in_block_begin,
				     in_next - in_block_begin,
				     c->p.g.sequences, in_next == in_end);
	} while (in_next != in_end && !os->overflow);
}